

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryControllersLoader15.cpp
# Opt level: O3

void __thiscall
COLLADASaxFWL::LibraryControllersLoader15::begin__vertex_weights(LibraryControllersLoader15 *this)

{
  _func_int **pp_Var1;
  byte *in_RSI;
  bool bVar2;
  vertex_weights__AttributeData attrData;
  uint local_10 [2];
  undefined8 local_8;
  
  bVar2 = (*in_RSI & 1) != 0;
  if (bVar2) {
    local_8 = *(undefined8 *)(in_RSI + 8);
  }
  local_10[0] = (uint)bVar2;
  pp_Var1 = (this->super_SourceArrayLoader15).super_IParserImpl15.super_ColladaParserAutoGen15.
            _vptr_ColladaParserAutoGen15;
  (**(code **)(*pp_Var1 + 0x108))(pp_Var1,local_10);
  return;
}

Assistant:

bool LibraryControllersLoader15::begin__vertex_weights( const COLLADASaxFWL15::vertex_weights__AttributeData& attributeData )
{
SaxVirtualFunctionTest15(begin__vertex_weights(attributeData));
COLLADASaxFWL::vertex_weights__AttributeData attrData;
attrData.present_attributes = 0;
if ( (attributeData.present_attributes & COLLADASaxFWL15::vertex_weights__AttributeData::ATTRIBUTE_COUNT_PRESENT) == COLLADASaxFWL15::vertex_weights__AttributeData::ATTRIBUTE_COUNT_PRESENT ) {
    attrData.count = attributeData.count;
    attrData.present_attributes |= COLLADASaxFWL::vertex_weights__AttributeData::ATTRIBUTE_COUNT_PRESENT;
}
return mLoader->begin__vertex_weights(attrData);
}